

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O0

void For_ManFileExperiment(void)

{
  abctime aVar1;
  void *__ptr;
  abctime aVar2;
  FILE *pFVar3;
  int RetValue;
  abctime clk;
  int Exp;
  int Size;
  int i;
  int *pBuffer;
  FILE *pFile;
  
  aVar1 = Abc_Clock();
  printf("2^%d machine words (%d bytes).\n",0x19,0x8000000);
  __ptr = malloc(0x8000000);
  for (Exp = 0; Exp < 0x2000000; Exp = Exp + 1) {
    *(int *)((long)__ptr + (long)Exp * 4) = Exp;
  }
  Abc_Print(1,"%s =","Fillup");
  aVar2 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar2 - aVar1) * 1.0) / 1000000.0);
  aVar1 = Abc_Clock();
  pFVar3 = fopen("test.txt","rb");
  fread(__ptr,1,0x8000000,pFVar3);
  fclose(pFVar3);
  Abc_Print(1,"%s =","Read  ");
  aVar2 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar2 - aVar1) * 1.0) / 1000000.0);
  aVar1 = Abc_Clock();
  pFVar3 = fopen("test.txt","wb");
  fwrite(__ptr,1,0x8000000,pFVar3);
  fclose(pFVar3);
  Abc_Print(1,"%s =","Write ");
  aVar2 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar2 - aVar1) * 1.0) / 1000000.0);
  return;
}

Assistant:

void For_ManFileExperiment()
{
    FILE * pFile;
    int * pBuffer;
    int i, Size, Exp = 25;
    abctime clk = Abc_Clock();
    int RetValue;

    Size = (1 << Exp);
    printf( "2^%d machine words (%d bytes).\n", Exp, (int)sizeof(int) * Size );

    pBuffer = ABC_ALLOC( int, Size );
    for ( i = 0; i < Size; i++ )
        pBuffer[i] = i;
ABC_PRT( "Fillup", Abc_Clock() - clk );

clk = Abc_Clock();
    pFile = fopen( "test.txt", "rb" );
    RetValue = fread( pBuffer, 1, sizeof(int) * Size, pFile );
    fclose( pFile );
ABC_PRT( "Read  ", Abc_Clock() - clk );

clk = Abc_Clock();
    pFile = fopen( "test.txt", "wb" );
    fwrite( pBuffer, 1, sizeof(int) * Size, pFile );
    fclose( pFile );
ABC_PRT( "Write ", Abc_Clock() - clk );
/*
2^25 machine words (134217728 bytes).
Fillup =    0.06 sec
Read   =    0.08 sec
Write  =    1.81 sec
*/
}